

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

DataType __thiscall
adios2::format::BP5Deserializer::TranslateFFSType2ADIOS(BP5Deserializer *this,char *Type,int size)

{
  int iVar1;
  undefined *puVar2;
  
  iVar1 = strcmp(Type,"integer");
  if (iVar1 == 0) {
    if (size - 1U < 8) {
      puVar2 = &DAT_0074c984;
LAB_0060a0a7:
      return *(DataType *)(puVar2 + (ulong)(size - 1) * 4);
    }
  }
  else {
    iVar1 = strcmp(Type,"unsigned integer");
    if (iVar1 == 0) {
      if (size - 1U < 8) {
        puVar2 = &DAT_0074c9a4;
        goto LAB_0060a0a7;
      }
    }
    else {
      iVar1 = strcmp(Type,"double");
      if ((iVar1 == 0) || (iVar1 = strcmp(Type,"float"), iVar1 == 0)) {
        if (size == 4) {
          return Float;
        }
        return size == 0x10 | Double;
      }
      iVar1 = strcmp(Type,"complex4");
      if (iVar1 == 0) {
        return FloatComplex;
      }
      iVar1 = strcmp(Type,"complex8");
      if (iVar1 == 0) {
        return DoubleComplex;
      }
      iVar1 = strcmp(Type,"string");
      if (iVar1 == 0) {
        return String;
      }
    }
  }
  return None;
}

Assistant:

DataType BP5Deserializer::TranslateFFSType2ADIOS(const char *Type, int size)
{
    if (strcmp(Type, "integer") == 0)
    {
        if (size == 1)
        {
            return DataType::Int8;
        }
        else if (size == 2)
        {
            return DataType::Int16;
        }
        else if (size == 4)
        {
            return DataType::Int32;
        }
        else if (size == 8)
        {
            return DataType::Int64;
        }
    }
    else if (strcmp(Type, "unsigned integer") == 0)
    {
        if (size == 1)
        {
            return DataType::UInt8;
        }
        else if (size == 2)
        {
            return DataType::UInt16;
        }
        else if (size == 4)
        {
            return DataType::UInt32;
        }
        else if (size == 8)
        {
            return DataType::UInt64;
        }
    }
    else if ((strcmp(Type, "double") == 0) || (strcmp(Type, "float") == 0))
    {
        if (size == sizeof(float))
        {
            return DataType::Float;
        }
        else if ((sizeof(long double) != sizeof(double)) && (size == sizeof(long double)))
        {
            return DataType::LongDouble;
        }
        else
        {
            return DataType::Double;
        }
    }
    else if (strcmp(Type, "complex4") == 0)
    {
        return DataType::FloatComplex;
    }
    else if (strcmp(Type, "complex8") == 0)
    {
        return DataType::DoubleComplex;
    }
    else if (strcmp(Type, "string") == 0)
    {
        return DataType::String;
    }

    return DataType::None;
}